

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gdImagePaletteCopy(gdImagePtr to,gdImagePtr from)

{
  byte bVar1;
  uchar *puVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int xlate [256];
  int local_438 [258];
  
  if (to->trueColor != 0) {
    return;
  }
  if (from->trueColor == 0) {
    for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
      local_438[lVar4] = -1;
    }
    for (lVar4 = 0; lVar4 < to->sy; lVar4 = lVar4 + 1) {
      for (lVar5 = 0; lVar5 < to->sx; lVar5 = lVar5 + 1) {
        puVar2 = to->pixels[lVar4];
        bVar1 = puVar2[lVar5];
        iVar3 = local_438[bVar1];
        if (iVar3 == -1) {
          iVar3 = gdImageColorClosestAlpha
                            (from,to->red[bVar1],to->green[bVar1],to->blue[bVar1],to->alpha[bVar1]);
          local_438[bVar1] = iVar3;
        }
        puVar2[lVar5] = (uchar)iVar3;
      }
    }
    for (lVar4 = 0; lVar5 = (long)from->colorsTotal, lVar4 < lVar5; lVar4 = lVar4 + 1) {
      to->red[lVar4] = from->red[lVar4];
      to->blue[lVar4] = from->blue[lVar4];
      to->green[lVar4] = from->green[lVar4];
      to->alpha[lVar4] = from->alpha[lVar4];
      to->open[lVar4] = 0;
    }
    for (; lVar5 < to->colorsTotal; lVar5 = lVar5 + 1) {
      to->open[lVar5] = 1;
    }
    to->colorsTotal = from->colorsTotal;
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImagePaletteCopy (gdImagePtr to, gdImagePtr from)
{
	int i;
	int x, y, p;
	int xlate[256];
	if (to->trueColor) {
		return;
	}
	if (from->trueColor) {
		return;
	}

	for (i = 0; i < 256; i++) {
		xlate[i] = -1;
	};

	for (y = 0; y < (to->sy); y++) {
		for (x = 0; x < (to->sx); x++) {
			/* Optimization: no gdImageGetPixel */
			p = to->pixels[y][x];
			if (xlate[p] == -1) {
				/* This ought to use HWB, but we don't have an alpha-aware
				   version of that yet. */
				xlate[p] =
				    gdImageColorClosestAlpha (from, to->red[p], to->green[p],
				                              to->blue[p], to->alpha[p]);
				/*printf("Mapping %d (%d, %d, %d, %d) to %d (%d, %d, %d, %d)\n", */
				/*      p,  to->red[p], to->green[p], to->blue[p], to->alpha[p], */
				/*      xlate[p], from->red[xlate[p]], from->green[xlate[p]], from->blue[xlate[p]], from->alpha[xlate[p]]); */
			};
			/* Optimization: no gdImageSetPixel */
			to->pixels[y][x] = xlate[p];
		};
	};

	for (i = 0; (i < (from->colorsTotal)); i++) {
		/*printf("Copying color %d (%d, %d, %d, %d)\n", i, from->red[i], from->blue[i], from->green[i], from->alpha[i]); */
		to->red[i] = from->red[i];
		to->blue[i] = from->blue[i];
		to->green[i] = from->green[i];
		to->alpha[i] = from->alpha[i];
		to->open[i] = 0;
	};

	for (i = from->colorsTotal; (i < to->colorsTotal); i++) {
		to->open[i] = 1;
	};

	to->colorsTotal = from->colorsTotal;

}